

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

void __thiscall Fl_Pixmap::copy_data(Fl_Pixmap *this)

{
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char **ppcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong __n;
  bool bVar14;
  int ncolors;
  int chars_per_pixel;
  uint local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  long local_48;
  char **local_40;
  Fl_Pixmap *local_38;
  
  if (this->alloc_data != 0) {
    return;
  }
  __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_60,&local_5c);
  uVar5 = local_60;
  uVar13 = (ulong)local_60;
  uVar1 = (this->super_Fl_Image).h_;
  local_58 = (ulong)uVar1;
  if ((int)local_60 < 0) {
    iVar6 = uVar1 + 2;
    bVar14 = SBORROW4(uVar1,-2);
    iVar4 = uVar1 + 2;
  }
  else {
    iVar6 = uVar1 + local_60 + 1;
    bVar14 = SBORROW4(uVar1 + local_60,-1);
    iVar4 = uVar1 + local_60 + 1;
  }
  local_48 = (long)local_5c;
  iVar2 = (this->super_Fl_Image).w_;
  uVar12 = 0xffffffffffffffff;
  if (bVar14 == iVar4 < 0) {
    uVar12 = (long)iVar6 << 3;
  }
  ppcVar7 = (char **)operator_new__(uVar12);
  ppcVar3 = (this->super_Fl_Image).data_;
  pcVar10 = *ppcVar3;
  sVar8 = strlen(pcVar10);
  pcVar9 = (char *)operator_new__(sVar8 + 1);
  *ppcVar7 = pcVar9;
  strcpy(pcVar9,pcVar10);
  local_40 = ppcVar7;
  local_38 = this;
  if ((int)uVar5 < 0) {
    local_60 = -uVar5;
    pcVar10 = (char *)operator_new__((ulong)(uVar5 * -4));
    ppcVar7[1] = pcVar10;
    memcpy(pcVar10,ppcVar3[1],(ulong)(uVar5 * -4));
    local_60 = 1;
    ppcVar7 = ppcVar7 + 2;
    uVar13 = 1;
  }
  else {
    ppcVar7 = ppcVar7 + 1;
    if (uVar5 == 0) {
      uVar13 = 0;
    }
    else {
      lVar11 = 0;
      local_50 = uVar13;
      do {
        pcVar10 = *(char **)((long)ppcVar3 + lVar11 + 8);
        sVar8 = strlen(pcVar10);
        pcVar9 = (char *)operator_new__(sVar8 + 1);
        *(char **)((long)ppcVar7 + lVar11) = pcVar9;
        strcpy(pcVar9,pcVar10);
        lVar11 = lVar11 + 8;
      } while (uVar13 * 8 - lVar11 != 0);
      ppcVar7 = (char **)((long)ppcVar7 + lVar11);
      uVar13 = local_50;
    }
  }
  if (0 < (int)local_58) {
    __n = iVar2 * local_48 + 1;
    uVar12 = 0;
    do {
      pcVar10 = (char *)operator_new__(__n);
      ppcVar7[uVar12] = pcVar10;
      memcpy(pcVar10,ppcVar3[(uVar13 & 0xffffffff) + uVar12 + 1],__n);
      uVar12 = uVar12 + 1;
    } while (local_58 != uVar12);
  }
  (local_38->super_Fl_Image).data_ = local_40;
  (local_38->super_Fl_Image).count_ = (int)local_58 + (int)uVar13 + 1;
  local_38->alloc_data = 1;
  return;
}

Assistant:

void Fl_Pixmap::copy_data() {
  if (alloc_data) return;

  char		**new_data,	// New data array
		**new_row;	// Current row in image
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * w() + 1;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[h() + 2];
  else new_data = new char *[h() + ncolors + 1];

  new_data[0] = new char[strlen(data()[0]) + 1];
  strcpy(new_data[0], data()[0]);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Copy image data...
  for (i = 0; i < h(); i ++, new_row ++) {
    *new_row = new char[chars_per_line];
    memcpy(*new_row, data()[i + ncolors + 1], chars_per_line);
  }

  // Update pointers...
  data((const char **)new_data, h() + ncolors + 1);
  alloc_data = 1;
}